

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall
Dashel::SocketServerStream::SocketServerStream(SocketServerStream *this,string *targetName)

{
  _func_int *p_Var1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  string *name;
  DashelException *pDVar5;
  int *piVar6;
  string local_230 [32];
  ostringstream local_210 [8];
  ostringstream portnum;
  socklen_t local_94;
  undefined1 local_90 [4];
  socklen_t sizeof_addr;
  sockaddr_in addr;
  int flag;
  IPV4Address bindAddress;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *targetName_local;
  SocketServerStream *this_local;
  
  local_18 = targetName;
  targetName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tcpin",&local_39);
  Stream::Stream((Stream *)&(this->super_SelectableStream).field_0x10,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bindAddress.port,"tcpin",(allocator<char> *)((long)&bindAddress.address + 3)
            );
  SelectableStream::SelectableStream
            (&this->super_SelectableStream,&PTR_construction_vtable_24__00152320,
             (string *)&bindAddress.port);
  std::__cxx11::string::~string((string *)&bindAddress.port);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bindAddress.address + 3));
  (this->super_SelectableStream)._vptr_SelectableStream = (_func_int **)&DAT_00152288;
  *(undefined ***)&(this->super_SelectableStream).field_0x10 = &PTR__SocketServerStream_001522f0;
  ParameterSet::add((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),
                    "tcpin:port=5000;address=0.0.0.0");
  p_Var1 = (this->super_SelectableStream)._vptr_SelectableStream[-3];
  pcVar4 = (char *)std::__cxx11::string::c_str();
  ParameterSet::add((ParameterSet *)(&(this->super_SelectableStream).field_0x30 + (long)p_Var1),
                    pcVar4);
  name = ParameterSet::get_abi_cxx11_
                   ((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"address");
  iVar3 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_SelectableStream).field_0x30 +
                     (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"port");
  IPV4Address::IPV4Address((IPV4Address *)(addr.sin_zero + 4),name,(unsigned_short)iVar3);
  iVar3 = socket(2,1,6);
  (this->super_SelectableStream).fd = iVar3;
  if ((this->super_SelectableStream).fd < 0) {
    pDVar5 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    DashelException::DashelException
              (pDVar5,ConnectionFailed,*piVar6,"Cannot create socket.",(Stream *)0x0);
    __cxa_throw(pDVar5,&DashelException::typeinfo,DashelException::~DashelException);
  }
  addr.sin_zero[0] = '\x01';
  addr.sin_zero[1] = '\0';
  addr.sin_zero[2] = '\0';
  addr.sin_zero[3] = '\0';
  iVar3 = setsockopt((this->super_SelectableStream).fd,1,2,addr.sin_zero,4);
  if (iVar3 < 0) {
    pDVar5 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    DashelException::DashelException
              (pDVar5,ConnectionFailed,*piVar6,
               "Cannot set address reuse flag on socket, probably the port is already in use.",
               (Stream *)0x0);
    __cxa_throw(pDVar5,&DashelException::typeinfo,DashelException::~DashelException);
  }
  local_90._0_2_ = 2;
  local_90._2_2_ = htons((uint16_t)flag);
  sizeof_addr = htonl(addr.sin_zero._4_4_);
  iVar3 = bind((this->super_SelectableStream).fd,(sockaddr *)local_90,0x10);
  if (iVar3 != 0) {
    pDVar5 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    DashelException::DashelException
              (pDVar5,ConnectionFailed,*piVar6,
               "Cannot bind socket to port, probably the port is already in use.",(Stream *)0x0);
    __cxa_throw(pDVar5,&DashelException::typeinfo,DashelException::~DashelException);
  }
  if ((uint16_t)flag == 0) {
    local_94 = 0x10;
    iVar3 = getsockname((this->super_SelectableStream).fd,(sockaddr *)local_90,&local_94);
    if (iVar3 != 0) {
      pDVar5 = (DashelException *)__cxa_allocate_exception(0x20);
      piVar6 = __errno_location();
      DashelException::DashelException
                (pDVar5,ConnectionFailed,*piVar6,"Cannot retrieve socket port assignment.",
                 (Stream *)0x0);
      __cxa_throw(pDVar5,&DashelException::typeinfo,DashelException::~DashelException);
    }
    ParameterSet::erase((ParameterSet *)
                        (&(this->super_SelectableStream).field_0x30 +
                        (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"port");
    std::__cxx11::ostringstream::ostringstream(local_210);
    uVar2 = ntohs(local_90._2_2_);
    std::ostream::operator<<((ostream *)local_210,uVar2);
    p_Var1 = (this->super_SelectableStream)._vptr_SelectableStream[-3];
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ParameterSet::addParam
              ((ParameterSet *)(&(this->super_SelectableStream).field_0x30 + (long)p_Var1),"port",
               pcVar4,true);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::ostringstream::~ostringstream(local_210);
  }
  iVar3 = listen((this->super_SelectableStream).fd,0x10);
  if (iVar3 < 0) {
    pDVar5 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    DashelException::DashelException
              (pDVar5,ConnectionFailed,*piVar6,"Cannot listen on socket.",(Stream *)0x0);
    __cxa_throw(pDVar5,&DashelException::typeinfo,DashelException::~DashelException);
  }
  return;
}

Assistant:

explicit SocketServerStream(const std::string& targetName) :
			Stream("tcpin"),
			SelectableStream("tcpin")
		{
			target.add("tcpin:port=5000;address=0.0.0.0");
			target.add(targetName.c_str());

			IPV4Address bindAddress(target.get("address"), target.get<int>("port"));

			// create socket
			fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (fd < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot create socket.");

			// reuse address
			int flag = 1;
			if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &flag, sizeof(flag)) < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot set address reuse flag on socket, probably the port is already in use.");

			// bind
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(bindAddress.port);
			addr.sin_addr.s_addr = htonl(bindAddress.address);
			if (::bind(fd, (struct sockaddr*)&addr, sizeof(addr)) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot bind socket to port, probably the port is already in use.");

			// retrieve port number, if a dynamic one was requested
			if (bindAddress.port == 0)
			{
				socklen_t sizeof_addr(sizeof(addr));
				if (::getsockname(fd, (struct sockaddr*)&addr, &sizeof_addr) != 0)
					throw DashelException(DashelException::ConnectionFailed, errno, "Cannot retrieve socket port assignment.");
				target.erase("port");
				ostringstream portnum;
				portnum << ntohs(addr.sin_port);
				target.addParam("port", portnum.str().c_str(), true);
			}

			// Listen on socket, backlog is sort of arbitrary.
			if (listen(fd, 16) < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot listen on socket.");
		}